

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O0

TPZSYsmpMatrix<double> * __thiscall
TPZSYsmpMatrix<double>::operator-(TPZSYsmpMatrix<double> *this,TPZSYsmpMatrix<double> *mat)

{
  double dVar1;
  int64_t iVar2;
  double *pdVar3;
  long in_RDX;
  long *in_RSI;
  TPZSYsmpMatrix<double> *in_RDI;
  int i;
  int64_t sizeA;
  TPZSYsmpMatrix<double> *res;
  TPZSYsmpMatrix<double> *cp;
  TPZSYsmpMatrix<double> *in_stack_ffffffffffffffc0;
  int local_38;
  
  cp = in_RDI;
  (**(code **)(*in_RSI + 0x250))(in_RSI,in_RSI,in_RDX);
  TPZSYsmpMatrix(in_stack_ffffffffffffffc0,cp);
  iVar2 = TPZVec<double>::size(&cp->fA);
  for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
    pdVar3 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDX + 0x60),(long)local_38);
    dVar1 = *pdVar3;
    pdVar3 = TPZVec<double>::operator[](&cp->fA,(long)local_38);
    *pdVar3 = *pdVar3 - dVar1;
  }
  return in_RDI;
}

Assistant:

TPZSYsmpMatrix<TVar> TPZSYsmpMatrix<TVar>::operator-(const TPZSYsmpMatrix<TVar>&mat) const
{
	CheckTypeCompatibility(this,&mat);
	auto res(*this);
  const auto sizeA = res.fA.size();
  for(auto i = 0; i < sizeA; i++) res.fA[i] -= mat.fA[i];
	return res;
}